

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

ImGuiOldColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  float *pfVar1;
  ImGuiOldColumns *__src;
  int iVar2;
  ImGuiOldColumns *pIVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ImDrawListSplitter IStack_38;
  
  iVar4 = (window->ColumnsStorage).Size;
  lVar5 = (long)iVar4;
  if (0 < lVar5) {
    pIVar3 = (window->ColumnsStorage).Data;
    do {
      if (pIVar3->ID == id) {
        return pIVar3;
      }
      pIVar3 = pIVar3 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  IStack_38._Channels.Data = (ImDrawChannel *)0x0;
  IStack_38._Current = 0;
  IStack_38._Count = 0;
  IStack_38._Channels.Size = 0;
  IStack_38._Channels.Capacity = 0;
  if (iVar4 == (window->ColumnsStorage).Capacity) {
    if (iVar4 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar4 / 2 + iVar4;
    }
    iVar6 = iVar4 + 1;
    if (iVar4 + 1 < iVar2) {
      iVar6 = iVar2;
    }
    pIVar3 = (ImGuiOldColumns *)MemAlloc((long)iVar6 * 0x88);
    __src = (window->ColumnsStorage).Data;
    if (__src != (ImGuiOldColumns *)0x0) {
      memcpy(pIVar3,__src,(long)(window->ColumnsStorage).Size * 0x88);
      MemFree((window->ColumnsStorage).Data);
    }
    (window->ColumnsStorage).Data = pIVar3;
    (window->ColumnsStorage).Capacity = iVar6;
    iVar4 = (window->ColumnsStorage).Size;
  }
  else {
    pIVar3 = (window->ColumnsStorage).Data;
  }
  pIVar3[iVar4].Splitter._Channels.Data = IStack_38._Channels.Data;
  pfVar1 = &pIVar3[iVar4].HostBackupClipRect.Min.y;
  *(undefined8 *)pfVar1 = 0;
  *(undefined8 *)(pfVar1 + 2) = 0;
  *(undefined8 *)(pfVar1 + 4) = 0;
  *(undefined8 *)(pfVar1 + 6) = 0;
  *(undefined8 *)(pfVar1 + 8) = 0;
  *(undefined8 *)(pfVar1 + 10) = 0;
  *(undefined8 *)(pfVar1 + 0xc) = IStack_38._0_8_;
  *(undefined8 *)(pfVar1 + 0xe) = IStack_38._Channels._0_8_;
  pIVar3 = pIVar3 + iVar4;
  pIVar3->ID = 0;
  pIVar3->Flags = 0;
  pIVar3->IsFirstFrame = false;
  pIVar3->IsBeingResized = false;
  *(undefined2 *)&pIVar3->field_0xa = 0;
  pIVar3->Current = 0;
  pIVar3->Count = 0;
  pIVar3->OffMinX = 0.0;
  pIVar3->OffMaxX = 0.0;
  pIVar3->LineMinY = 0.0;
  pIVar3->LineMaxY = 0.0;
  pIVar3->HostCursorPosY = 0.0;
  pIVar3->HostCursorMaxPosX = 0.0;
  (pIVar3->HostInitialClipRect).Min.x = 0.0;
  *(undefined8 *)&(pIVar3->HostInitialClipRect).Min.y = 0;
  *(undefined8 *)&(pIVar3->HostInitialClipRect).Max.y = 0;
  (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
  ImDrawListSplitter::ClearFreeMemory(&IStack_38);
  if (IStack_38._Channels.Data != (ImDrawChannel *)0x0) {
    MemFree(IStack_38._Channels.Data);
  }
  pIVar3 = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
  pIVar3->ID = id;
  return pIVar3;
}

Assistant:

ImGuiOldColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiOldColumns());
    ImGuiOldColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}